

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGui::NavMoveRequestApplyResult(ImGui *this)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  float fVar3;
  ImVec2 IVar4;
  byte bVar5;
  uint uVar6;
  ImGuiID IVar7;
  ImGuiNavLayer IVar8;
  undefined4 uVar9;
  ImGuiWindow *pIVar10;
  undefined4 uVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  ImGuiNavItemData *pIVar14;
  float fVar15;
  ImRect rect_abs;
  ImRect local_20;
  
  pIVar12 = GImGui;
  if ((GImGui->NavMoveResultLocal).ID == 0) {
    pIVar14 = (ImGuiNavItemData *)0x0;
    if ((GImGui->NavMoveResultOther).ID != 0) {
      pIVar14 = &GImGui->NavMoveResultOther;
    }
  }
  else {
    pIVar14 = &GImGui->NavMoveResultLocal;
  }
  uVar6 = GImGui->NavMoveFlags;
  if (((uVar6 >> 10 & 1) != 0) &&
     (((GImGui->NavTabbingCounter == 1 || (GImGui->NavTabbingDir == 0)) &&
      ((GImGui->NavTabbingResultFirst).ID != 0)))) {
    pIVar14 = &GImGui->NavTabbingResultFirst;
  }
  if (pIVar14 == (ImGuiNavItemData *)0x0) {
    if ((uVar6 >> 10 & 1) != 0) {
      GImGui->NavMoveFlags = uVar6 | 0x1000;
    }
    if (pIVar12->NavId == 0) {
      return;
    }
    bVar5 = *(byte *)((long)&pIVar12->NavMoveFlags + 1);
    goto joined_r0x001f83ab;
  }
  if ((((uVar6 & 0x20) != 0) && (IVar7 = (GImGui->NavMoveResultLocalVisible).ID, IVar7 != 0)) &&
     (IVar7 != GImGui->NavId)) {
    pIVar14 = &GImGui->NavMoveResultLocalVisible;
  }
  if (((pIVar14 != &GImGui->NavMoveResultOther) && ((GImGui->NavMoveResultOther).ID != 0)) &&
     (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
    fVar15 = (GImGui->NavMoveResultOther).DistBox;
    fVar3 = pIVar14->DistBox;
    if (fVar3 <= fVar15) {
      if (((fVar15 != fVar3) || (NAN(fVar15) || NAN(fVar3))) ||
         (pfVar1 = &(GImGui->NavMoveResultOther).DistCenter,
         pIVar14->DistCenter < *pfVar1 || pIVar14->DistCenter == *pfVar1)) goto LAB_001f833d;
    }
    pIVar14 = &GImGui->NavMoveResultOther;
  }
LAB_001f833d:
  if (GImGui->NavLayer == ImGuiNavLayer_Main) {
    if ((uVar6 & 0x40) == 0) {
      IVar4 = (pIVar14->Window->DC).CursorStartPos;
      local_20.Max.x = IVar4.x;
      local_20.Max.y = IVar4.y;
      IVar4 = (pIVar14->RectRel).Min;
      local_20.Min.x = IVar4.x + local_20.Max.x;
      local_20.Min.y = IVar4.y + local_20.Max.y;
      IVar4 = (pIVar14->RectRel).Max;
      local_20.Max.x = IVar4.x + local_20.Max.x;
      local_20.Max.y = IVar4.y + local_20.Max.y;
      ScrollToRectEx(pIVar14->Window,&local_20,GImGui->NavMoveScrollFlags);
    }
    else {
      fVar15 = 0.0;
      if (GImGui->NavMoveDir == 2) {
        fVar15 = (pIVar14->Window->ScrollMax).y;
      }
      pIVar10 = pIVar14->Window;
      (pIVar10->ScrollTarget).y = fVar15;
      (pIVar10->ScrollTargetCenterRatio).y = 0.0;
      (pIVar10->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if (pIVar12->NavWindow != pIVar14->Window) {
    if ((pIVar12->DebugLogFlags & 2) != 0) {
      DebugLog("[focus] NavMoveRequest: SetNavWindow(\"%s\")\n");
    }
    pIVar12->NavWindow = pIVar14->Window;
  }
  if (pIVar12->ActiveId != pIVar14->ID) {
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  if (pIVar12->NavId != pIVar14->ID) {
    pIVar12->NavJustMovedToId = pIVar14->ID;
    pIVar12->NavJustMovedToFocusScopeId = pIVar14->FocusScopeId;
    pIVar12->NavJustMovedToKeyMods = pIVar12->NavMoveKeyMods;
  }
  if ((pIVar12->DebugLogFlags & 8) != 0) {
    DebugLog("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n",
             (ulong)pIVar14->ID,(ulong)pIVar12->NavLayer,pIVar12->NavWindow->Name);
  }
  pIVar13 = GImGui;
  IVar8 = pIVar12->NavLayer;
  uVar9 = pIVar14->ID;
  uVar11 = pIVar14->FocusScopeId;
  GImGui->NavLayer = IVar8;
  pIVar13->NavId = uVar9;
  pIVar13->NavFocusScopeId = uVar11;
  pIVar13->NavWindow->NavLastIds[IVar8] = uVar9;
  IVar4 = (pIVar14->RectRel).Max;
  pIVar2 = &pIVar13->NavWindow->NavRectRel[IVar8].Min;
  *pIVar2 = (pIVar14->RectRel).Min;
  pIVar2[1] = IVar4;
  if ((((uint)pIVar12->NavMoveFlags >> 10 & 1) != 0) && ((pIVar14->InFlags & 0x400) != 0)) {
    pIVar12->NavNextActivateId = pIVar14->ID;
    pIVar12->NavNextActivateFlags = 5;
    pIVar12->NavMoveFlags = pIVar12->NavMoveFlags | 0x1000;
  }
  if ((pIVar12->NavMoveFlags & 0x800) != 0) {
    pIVar12->NavNextActivateId = pIVar14->ID;
    pIVar12->NavNextActivateFlags = 0;
  }
  bVar5 = *(byte *)((long)&pIVar12->NavMoveFlags + 1);
  pIVar12 = GImGui;
joined_r0x001f83ab:
  if ((bVar5 & 0x10) == 0) {
    pIVar12->NavMousePosDirty = true;
    pIVar12->NavDisableHighlight = false;
    pIVar12->NavDisableMouseHover = true;
  }
  return;
}

Assistant:

void ImGui::NavMoveRequestApplyResult()
{
    ImGuiContext& g = *GImGui;
#if IMGUI_DEBUG_NAV_SCORING
    if (g.NavMoveFlags & ImGuiNavMoveFlags_DebugNoResult) // [DEBUG] Scoring all items in NavWindow at all times
        return;
#endif

    // Select which result to use
    ImGuiNavItemData* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : (g.NavMoveResultOther.ID != 0) ? &g.NavMoveResultOther : NULL;

    // Tabbing forward wrap
    if (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing)
        if ((g.NavTabbingCounter == 1 || g.NavTabbingDir == 0) && g.NavTabbingResultFirst.ID)
            result = &g.NavTabbingResultFirst;

    // In a situation when there are no results but NavId != 0, re-enable the Navigation highlight (because g.NavId is not considered as a possible result)
    if (result == NULL)
    {
        if (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing)
            g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
        if (g.NavId != 0 && (g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
            NavRestoreHighlightAfterMove();
        return;
    }

    // PageUp/PageDown behavior first jumps to the bottom/top mostly visible item, _otherwise_ use the result from the previous/next page.
    if (g.NavMoveFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet)
        if (g.NavMoveResultLocalVisible.ID != 0 && g.NavMoveResultLocalVisible.ID != g.NavId)
            result = &g.NavMoveResultLocalVisible;

    // Maybe entering a flattened child from the outside? In this case solve the tie using the regular scoring rules.
    if (result != &g.NavMoveResultOther && g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow)
        if ((g.NavMoveResultOther.DistBox < result->DistBox) || (g.NavMoveResultOther.DistBox == result->DistBox && g.NavMoveResultOther.DistCenter < result->DistCenter))
            result = &g.NavMoveResultOther;
    IM_ASSERT(g.NavWindow && result->Window);

    // Scroll to keep newly navigated item fully into view.
    if (g.NavLayer == ImGuiNavLayer_Main)
    {
        if (g.NavMoveFlags & ImGuiNavMoveFlags_ScrollToEdgeY)
        {
            // FIXME: Should remove this
            float scroll_target = (g.NavMoveDir == ImGuiDir_Up) ? result->Window->ScrollMax.y : 0.0f;
            SetScrollY(result->Window, scroll_target);
        }
        else
        {
            ImRect rect_abs = WindowRectRelToAbs(result->Window, result->RectRel);
            ScrollToRectEx(result->Window, rect_abs, g.NavMoveScrollFlags);
        }
    }

    if (g.NavWindow != result->Window)
    {
        IMGUI_DEBUG_LOG_FOCUS("[focus] NavMoveRequest: SetNavWindow(\"%s\")\n", result->Window->Name);
        g.NavWindow = result->Window;
    }
    if (g.ActiveId != result->ID)
        ClearActiveID();
    if (g.NavId != result->ID)
    {
        // Don't set NavJustMovedToId if just landed on the same spot (which may happen with ImGuiNavMoveFlags_AllowCurrentNavId)
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = g.NavMoveKeyMods;
    }

    // Focus
    IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);

    // Tabbing: Activates Inputable or Focus non-Inputable
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && (result->InFlags & ImGuiItemFlags_Inputable))
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_PreferInput | ImGuiActivateFlags_TryToPreserveState;
        g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
    }

    // Activate
    if (g.NavMoveFlags & ImGuiNavMoveFlags_Activate)
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_None;
    }

    // Enable nav highlight
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
        NavRestoreHighlightAfterMove();
}